

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O2

void interpolate(uint8_t *input,int in_length,uint8_t *output,int out_length)

{
  int iVar1;
  InterpKernel *paiVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint8_t uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  
  iVar1 = out_length / 2;
  iVar13 = 0;
  uVar7 = (uint)(in_length * 0x4000 + iVar1) / (uint)out_length;
  iVar4 = -iVar1;
  if (in_length - out_length != 0 && out_length <= in_length) {
    iVar4 = iVar1;
  }
  iVar4 = ((in_length - out_length) * 0x2000 + iVar4) / out_length;
  uVar14 = iVar4 + 0x80;
  for (uVar3 = uVar14; (int)uVar3 < 0xc000; uVar3 = uVar3 + uVar7) {
    iVar13 = iVar13 + 1;
  }
  iVar1 = iVar4 + (out_length + -1) * uVar7 + 0x80;
  iVar4 = out_length;
  for (; in_length <= (iVar1 >> 0xe) + 4; iVar1 = iVar1 - uVar7) {
    iVar4 = iVar4 + -1;
  }
  paiVar2 = choose_interp_filter(in_length,out_length);
  if (iVar4 + -1 < iVar13) {
    uVar3 = 0;
    if (out_length < 1) {
      out_length = uVar3;
    }
    for (uVar5 = 0; uVar5 != out_length; uVar5 = uVar5 + 1) {
      iVar4 = 0;
      for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
        uVar11 = ((int)uVar14 >> 0xe) + -3 + (int)lVar10;
        if ((int)(in_length - 1U) <= (int)uVar11) {
          uVar11 = in_length - 1U;
        }
        if ((int)uVar11 < 1) {
          uVar11 = uVar3;
        }
        iVar4 = iVar4 + (uint)input[uVar11] *
                        (int)*(short *)((long)*paiVar2 + lVar10 * 2 + (ulong)(uVar14 >> 4 & 0x3f0));
      }
      uVar11 = iVar4 + 0x40 >> 7;
      if ((int)uVar11 < 1) {
        uVar11 = uVar3;
      }
      uVar8 = (uint8_t)uVar11;
      if (0xfe < (int)uVar11) {
        uVar8 = 0xff;
      }
      *output = uVar8;
      output = output + 1;
      uVar14 = uVar14 + uVar7;
    }
  }
  else {
    for (iVar1 = 0; iVar13 != iVar1; iVar1 = iVar1 + 1) {
      iVar9 = 0;
      for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
        uVar3 = ((int)uVar14 >> 0xe) + -3 + (int)lVar10;
        uVar6 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar6 = 0;
        }
        iVar9 = iVar9 + (uint)input[uVar6] *
                        (int)*(short *)((long)*paiVar2 + lVar10 * 2 + (ulong)(uVar14 >> 4 & 0x3f0));
      }
      iVar9 = iVar9 + 0x40 >> 7;
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      *output = (uint8_t)iVar9;
      output = output + 1;
      uVar14 = uVar14 + uVar7;
    }
    for (; iVar13 <= iVar4 + -1; iVar13 = iVar13 + 1) {
      lVar12 = 0;
      iVar1 = 0;
      for (lVar10 = -3; lVar10 != 5; lVar10 = lVar10 + 1) {
        iVar1 = iVar1 + (uint)input[lVar10 + ((int)uVar14 >> 0xe)] *
                        (int)*(short *)((long)*paiVar2 + lVar12 * 2 + (ulong)(uVar14 >> 4 & 0x3f0));
        lVar12 = lVar12 + 1;
      }
      iVar1 = iVar1 + 0x40 >> 7;
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      if (0xfe < iVar1) {
        iVar1 = 0xff;
      }
      *output = (uint8_t)iVar1;
      output = output + 1;
      uVar14 = uVar14 + uVar7;
    }
    for (; iVar4 < out_length; iVar4 = iVar4 + 1) {
      iVar1 = 0;
      for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
        iVar13 = ((int)uVar14 >> 0xe) + -3 + (int)lVar10;
        if (in_length + -1 <= iVar13) {
          iVar13 = in_length + -1;
        }
        iVar1 = iVar1 + (uint)input[iVar13] *
                        (int)*(short *)((long)*paiVar2 + lVar10 * 2 + (ulong)(uVar14 >> 4 & 0x3f0));
      }
      iVar1 = iVar1 + 0x40 >> 7;
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      uVar8 = (uint8_t)iVar1;
      if (0xfe < iVar1) {
        uVar8 = 0xff;
      }
      *output = uVar8;
      output = output + 1;
      uVar14 = uVar14 + uVar7;
    }
  }
  return;
}

Assistant:

static void interpolate(const uint8_t *const input, int in_length,
                        uint8_t *output, int out_length) {
  const InterpKernel *interp_filters =
      choose_interp_filter(in_length, out_length);

  interpolate_core(input, in_length, output, out_length, &interp_filters[0][0],
                   SUBPEL_TAPS);
}